

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polyline.cc
# Opt level: O0

S2LatLngRect * __thiscall
S2Polyline::GetRectBound(S2LatLngRect *__return_storage_ptr__,S2Polyline *this)

{
  int iVar1;
  S2Point *b;
  int local_6c;
  undefined1 local_68 [4];
  int i;
  S2LatLngRectBounder bounder;
  S2Polyline *this_local;
  
  bounder.bound_.lng_.bounds_.c_[1] = (VType)this;
  S2LatLngRectBounder::S2LatLngRectBounder((S2LatLngRectBounder *)local_68);
  local_6c = 0;
  while( true ) {
    iVar1 = num_vertices(this);
    if (iVar1 <= local_6c) break;
    b = vertex(this,local_6c);
    S2LatLngRectBounder::AddPoint((S2LatLngRectBounder *)local_68,b);
    local_6c = local_6c + 1;
  }
  S2LatLngRectBounder::GetBound(__return_storage_ptr__,(S2LatLngRectBounder *)local_68);
  S2LatLngRectBounder::~S2LatLngRectBounder((S2LatLngRectBounder *)local_68);
  return __return_storage_ptr__;
}

Assistant:

S2LatLngRect S2Polyline::GetRectBound() const {
  S2LatLngRectBounder bounder;
  for (int i = 0; i < num_vertices(); ++i) {
    bounder.AddPoint(vertex(i));
  }
  return bounder.GetBound();
}